

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum-dtoa.cpp
# Opt level: O2

void __thiscall
icu_63::double_conversion::BignumDtoa
          (double_conversion *this,double v,BignumDtoaMode mode,int requested_digits,
          Vector<char> buffer,int *length,int *decimal_point)

{
  double dVar1;
  uint16_t uVar2;
  int iVar3;
  BignumDtoaMode BVar4;
  byte *pbVar5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  undefined4 in_register_00000014;
  char *pcVar9;
  ulong uVar10;
  ulong factor;
  uint uVar11;
  uint uVar12;
  Bignum *pBVar13;
  int *piVar14;
  bool bVar15;
  bool bVar16;
  float fVar17;
  Vector<char> buffer_00;
  undefined4 in_stack_fffffffffffff748;
  Bignum denominator;
  Bignum numerator;
  Bignum delta_plus;
  Bignum delta_minus;
  
  pcVar9 = (char *)CONCAT44(in_register_00000014,requested_digits);
  piVar14 = buffer._8_8_;
  uVar12 = (uint)this;
  if (uVar12 == 1) {
    fVar17 = (float)v;
    uVar8 = (uint)fVar17 & 0x7fffff;
    bVar15 = ((uint)fVar17 & 0x7f800000) == 0;
    uVar11 = uVar8 + 0x800000;
    if (bVar15) {
      uVar11 = uVar8;
    }
    factor = (ulong)uVar11;
    iVar3 = -0x95;
    if (!bVar15) {
      iVar3 = ((uint)fVar17 >> 0x17 & 0xff) - 0x96;
    }
    bVar15 = uVar8 == 0;
    bVar16 = ((uint)fVar17 & 0x7f000000) == 0;
  }
  else {
    uVar10 = (ulong)v & 0xfffffffffffff;
    bVar15 = ((ulong)v & 0x7ff0000000000000) == 0;
    factor = uVar10 | 0x10000000000000;
    if (bVar15) {
      factor = uVar10;
    }
    iVar3 = -0x432;
    if (!bVar15) {
      iVar3 = ((uint)((ulong)v >> 0x34) & 0x7ff) - 0x433;
    }
    bVar15 = uVar10 == 0;
    bVar16 = ((ulong)v & 0x7fe0000000000000) == 0;
  }
  iVar7 = iVar3 + 0x34;
  for (uVar10 = factor; (uVar10 & 0x10000000000000) == 0; uVar10 = uVar10 * 2) {
    iVar7 = iVar7 + -1;
  }
  dVar1 = ceil((double)iVar7 * 0.30102999566398114 + -1e-10);
  uVar11 = (uint)dVar1;
  if ((uVar12 == 2) && ((int)mode < (int)~uVar11)) {
    *pcVar9 = '\0';
    *piVar14 = 0;
    *length = -mode;
    return;
  }
  Bignum::Bignum(&numerator);
  Bignum::Bignum(&denominator);
  Bignum::Bignum(&delta_minus);
  Bignum::Bignum(&delta_plus);
  if (iVar3 < 0) {
    if ((int)uVar11 < 0) {
      Bignum::AssignPowerUInt16(&numerator,10,-uVar11);
      if (uVar12 < 2) {
        Bignum::AssignBignum(&delta_plus,&numerator);
        Bignum::AssignBignum(&delta_minus,&numerator);
        Bignum::MultiplyByUInt64(&numerator,factor);
        Bignum::AssignUInt16(&denominator,1);
        Bignum::ShiftLeft(&denominator,-iVar3);
        Bignum::ShiftLeft(&numerator,1);
        iVar3 = 1;
      }
      else {
        Bignum::MultiplyByUInt64(&numerator,factor);
        Bignum::AssignUInt16(&denominator,1);
        iVar3 = -iVar3;
      }
      pBVar13 = &denominator;
      goto LAB_00270cb2;
    }
    Bignum::AssignUInt64(&numerator,factor);
    Bignum::AssignPowerUInt16(&denominator,10,uVar11);
    Bignum::ShiftLeft(&denominator,-iVar3);
    if (1 < uVar12) goto LAB_00270cf9;
    Bignum::ShiftLeft(&denominator,1);
    Bignum::ShiftLeft(&numerator,1);
    Bignum::AssignUInt16(&delta_plus,1);
    Bignum::AssignUInt16(&delta_minus,1);
LAB_00270cb7:
    if (!(bool)(!bVar16 & bVar15 ^ 1U | 1 < uVar12)) {
      Bignum::ShiftLeft(&denominator,1);
      Bignum::ShiftLeft(&numerator,1);
      Bignum::ShiftLeft(&delta_plus,1);
    }
  }
  else {
    Bignum::AssignUInt64(&numerator,factor);
    Bignum::ShiftLeft(&numerator,iVar3);
    Bignum::AssignPowerUInt16(&denominator,10,uVar11);
    if (uVar12 < 2) {
      Bignum::ShiftLeft(&denominator,1);
      Bignum::ShiftLeft(&numerator,1);
      Bignum::AssignUInt16(&delta_plus,1);
      Bignum::ShiftLeft(&delta_plus,iVar3);
      pBVar13 = &delta_minus;
      Bignum::AssignUInt16(pBVar13,1);
LAB_00270cb2:
      Bignum::ShiftLeft(pBVar13,iVar3);
      goto LAB_00270cb7;
    }
  }
LAB_00270cf9:
  iVar3 = Bignum::PlusCompare(&numerator,&delta_plus,&denominator);
  if ((factor & 1) == 0) {
    if (iVar3 < 0) goto LAB_00270d20;
LAB_00270d79:
    *length = uVar11 + 1;
  }
  else {
    if (0 < iVar3) goto LAB_00270d79;
LAB_00270d20:
    *length = uVar11;
    Bignum::Times10(&numerator);
    bVar15 = Bignum::Equal(&delta_minus,&delta_plus);
    Bignum::Times10(&delta_minus);
    if (bVar15) {
      Bignum::AssignBignum(&delta_plus,&delta_minus);
    }
    else {
      Bignum::Times10(&delta_plus);
    }
  }
  if (uVar12 < 2) {
    bVar15 = Bignum::Equal(&delta_minus,&delta_plus);
    uVar12 = (uint)bVar15;
    pBVar13 = &delta_plus;
    if (bVar15) {
      pBVar13 = &delta_minus;
    }
    *piVar14 = 0;
    while( true ) {
      uVar2 = Bignum::DivideModuloIntBignum(&numerator,&denominator);
      iVar3 = *piVar14;
      *piVar14 = iVar3 + 1;
      pcVar9[iVar3] = (char)uVar2 + '0';
      if ((factor & 1) == 0) {
        bVar15 = Bignum::LessEqual(&numerator,&delta_minus);
        iVar3 = -1;
      }
      else {
        bVar15 = Bignum::Less(&numerator,&delta_minus);
        iVar3 = 0;
      }
      iVar7 = Bignum::PlusCompare(&numerator,pBVar13,&denominator);
      if ((bVar15 != false) || (iVar3 < iVar7)) break;
      Bignum::Times10(&numerator);
      Bignum::Times10(&delta_minus);
      if ((char)uVar12 == '\0') {
        Bignum::Times10(&delta_plus);
      }
    }
    if (bVar15 == true && iVar3 < iVar7) {
      iVar3 = Bignum::PlusCompare(&numerator,&numerator,&denominator);
      if (iVar3 < 0) goto LAB_00270f59;
      pbVar5 = (byte *)(pcVar9 + (long)*piVar14 + -1);
      bVar6 = *pbVar5;
      if ((iVar3 == 0) && ((bVar6 & 1) == 0)) goto LAB_00270f59;
    }
    else {
      if (bVar15 != false) goto LAB_00270f59;
      pbVar5 = (byte *)(pcVar9 + (long)*piVar14 + -1);
      bVar6 = *pbVar5;
    }
    *pbVar5 = bVar6 + 1;
    goto LAB_00270f59;
  }
  if (uVar12 == 2) {
    BVar4 = -*length;
    if ((int)mode < (int)BVar4) {
      *length = -mode;
    }
    else {
      if (BVar4 != mode) {
        mode = *length + mode;
        goto LAB_00270daf;
      }
      Bignum::Times10(&denominator);
      iVar3 = Bignum::PlusCompare(&numerator,&numerator,&denominator);
      if (-1 < iVar3) {
        *pcVar9 = '1';
        *piVar14 = 1;
        *length = *length + 1;
        goto LAB_00270f59;
      }
    }
    *piVar14 = 0;
  }
  else {
    if (uVar12 != 3) {
      abort();
    }
LAB_00270daf:
    buffer_00._8_8_ = piVar14;
    buffer_00.start_ = pcVar9;
    GenerateCountedDigits
              (mode,length,&numerator,&denominator,buffer_00,
               (int *)CONCAT44(uVar12,in_stack_fffffffffffff748));
  }
LAB_00270f59:
  pcVar9[*piVar14] = '\0';
  return;
}

Assistant:

void BignumDtoa(double v, BignumDtoaMode mode, int requested_digits,
                Vector<char> buffer, int* length, int* decimal_point) {
  ASSERT(v > 0);
  ASSERT(!Double(v).IsSpecial());
  uint64_t significand;
  int exponent;
  bool lower_boundary_is_closer;
  if (mode == BIGNUM_DTOA_SHORTEST_SINGLE) {
    float f = static_cast<float>(v);
    ASSERT(f == v);
    significand = Single(f).Significand();
    exponent = Single(f).Exponent();
    lower_boundary_is_closer = Single(f).LowerBoundaryIsCloser();
  } else {
    significand = Double(v).Significand();
    exponent = Double(v).Exponent();
    lower_boundary_is_closer = Double(v).LowerBoundaryIsCloser();
  }
  bool need_boundary_deltas =
      (mode == BIGNUM_DTOA_SHORTEST || mode == BIGNUM_DTOA_SHORTEST_SINGLE);

  bool is_even = (significand & 1) == 0;
  int normalized_exponent = NormalizedExponent(significand, exponent);
  // estimated_power might be too low by 1.
  int estimated_power = EstimatePower(normalized_exponent);

  // Shortcut for Fixed.
  // The requested digits correspond to the digits after the point. If the
  // number is much too small, then there is no need in trying to get any
  // digits.
  if (mode == BIGNUM_DTOA_FIXED && -estimated_power - 1 > requested_digits) {
    buffer[0] = '\0';
    *length = 0;
    // Set decimal-point to -requested_digits. This is what Gay does.
    // Note that it should not have any effect anyways since the string is
    // empty.
    *decimal_point = -requested_digits;
    return;
  }

  Bignum numerator;
  Bignum denominator;
  Bignum delta_minus;
  Bignum delta_plus;
  // Make sure the bignum can grow large enough. The smallest double equals
  // 4e-324. In this case the denominator needs fewer than 324*4 binary digits.
  // The maximum double is 1.7976931348623157e308 which needs fewer than
  // 308*4 binary digits.
  ASSERT(Bignum::kMaxSignificantBits >= 324*4);
  InitialScaledStartValues(significand, exponent, lower_boundary_is_closer,
                           estimated_power, need_boundary_deltas,
                           &numerator, &denominator,
                           &delta_minus, &delta_plus);
  // We now have v = (numerator / denominator) * 10^estimated_power.
  FixupMultiply10(estimated_power, is_even, decimal_point,
                  &numerator, &denominator,
                  &delta_minus, &delta_plus);
  // We now have v = (numerator / denominator) * 10^(decimal_point-1), and
  //  1 <= (numerator + delta_plus) / denominator < 10
  switch (mode) {
    case BIGNUM_DTOA_SHORTEST:
    case BIGNUM_DTOA_SHORTEST_SINGLE:
      GenerateShortestDigits(&numerator, &denominator,
                             &delta_minus, &delta_plus,
                             is_even, buffer, length);
      break;
    case BIGNUM_DTOA_FIXED:
      BignumToFixed(requested_digits, decimal_point,
                    &numerator, &denominator,
                    buffer, length);
      break;
    case BIGNUM_DTOA_PRECISION:
      GenerateCountedDigits(requested_digits, decimal_point,
                            &numerator, &denominator,
                            buffer, length);
      break;
    default:
      UNREACHABLE();
  }
  buffer[*length] = '\0';
}